

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-activation.c
# Opt level: O0

int borg_findact(char *act_name)

{
  wchar_t wVar1;
  char *what;
  activation *local_20;
  activation *act;
  char *act_name_local;
  
  local_20 = activations + 1;
  while( true ) {
    if (local_20 == (activation *)0x0) {
      what = format("**STARTUP FAILURE** activation lookup failure - %s ",act_name);
      borg_note(what);
      borg_init_failure = true;
      return 0;
    }
    wVar1 = my_stricmp(local_20->name,act_name);
    if (wVar1 == L'\0') break;
    local_20 = local_20->next;
  }
  return local_20->index;
}

Assistant:

int borg_findact(const char *act_name)
{
    struct activation *act = &activations[1];
    while (act) {
        if (!my_stricmp(act->name, act_name)) {
            return act->index;
        }
        act = act->next;
    }

    borg_note(format(
        "**STARTUP FAILURE** activation lookup failure - %s ", act_name));
    borg_init_failure = true;
    return 0;
}